

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool ON_WriteMultipleObjectArchive
               (ON_BinaryArchive *archive,int version,size_t object_list_count,
               ON_Object **object_list)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ON_Layer *this;
  ON_Brep *this_00;
  ON_BrepEdge *pOVar4;
  ON_3dmObjectAttributes *this_01;
  ON_ModelGeometryComponent *pOVar5;
  ON_BrepTrim *pOVar6;
  ON_BrepLoop *pOVar7;
  ON_BrepFace *pOVar8;
  ON_CurveProxy *pOVar9;
  ON_SurfaceProxy *pOVar10;
  size_t sVar11;
  ON_UUID OVar12;
  ONX_Model model;
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  ONX_Model local_bb8;
  
  if (object_list == (ON_Object **)0x0 || object_list_count == 0) {
    bVar1 = false;
  }
  else {
    ONX_Model::ONX_Model((ONX_Model *)(local_bc8 + 0x10));
    ON_3dmRevisionHistory::NewRevision(&local_bb8.m_properties.m_RevisionHistory);
    ON_UnitSystem::SetUnitSystem(&local_bb8.m_settings.m_ModelUnitsAndTolerances.m_unit_system,None)
    ;
    this = (ON_Layer *)operator_new(0xe8);
    ON_Layer::ON_Layer(this,&ON_Layer::Default);
    ON_ModelComponent::SetId((ON_ModelComponent *)this);
    ON_ModelComponent::SetIndex((ON_ModelComponent *)this,0);
    ONX_Model::AddManagedModelComponent
              ((ONX_Model *)local_bc8,(ON_ModelComponent *)(local_bc8 + 0x10),SUB81(this,0));
    ON_ModelComponentReference::~ON_ModelComponentReference((ON_ModelComponentReference *)local_bc8)
    ;
    sVar11 = 0;
    do {
      this_00 = (ON_Brep *)ON_Geometry::Cast(object_list[sVar11]);
      pOVar4 = ON_BrepEdge::Cast((ON_Object *)this_00);
      if (pOVar4 == (ON_BrepEdge *)0x0) {
        pOVar6 = ON_BrepTrim::Cast((ON_Object *)this_00);
        if (pOVar6 == (ON_BrepTrim *)0x0) {
          pOVar7 = ON_BrepLoop::Cast((ON_Object *)this_00);
          if (pOVar7 == (ON_BrepLoop *)0x0) {
            pOVar8 = ON_BrepFace::Cast((ON_Object *)this_00);
            if (pOVar8 == (ON_BrepFace *)0x0) {
              pOVar9 = ON_CurveProxy::Cast((ON_Object *)this_00);
              if (pOVar9 == (ON_CurveProxy *)0x0) {
                pOVar10 = ON_SurfaceProxy::Cast((ON_Object *)this_00);
                if (pOVar10 != (ON_SurfaceProxy *)0x0) {
                  this_00 = (ON_Brep *)ON_SurfaceProxy::ProxySurface((ON_SurfaceProxy *)this_00);
                }
              }
              else {
                this_00 = (ON_Brep *)ON_CurveProxy::ProxyCurve((ON_CurveProxy *)this_00);
              }
            }
            else {
              this_00 = ON_BrepFace::Brep((ON_BrepFace *)this_00);
            }
          }
          else {
            this_00 = ON_BrepLoop::Brep((ON_BrepLoop *)this_00);
          }
          goto LAB_003ac057;
        }
      }
      else {
        this_00 = ON_BrepEdge::Brep((ON_BrepEdge *)this_00);
LAB_003ac057:
        if (this_00 != (ON_Brep *)0x0) {
          this_01 = (ON_3dmObjectAttributes *)operator_new(0x170);
          ON_3dmObjectAttributes::ON_3dmObjectAttributes(this_01);
          iVar2 = ON_ModelComponent::Index((ON_ModelComponent *)this);
          this_01->m_layer_index = iVar2;
          OVar12 = ON_CreateId();
          this_01->m_uuid = OVar12;
          pOVar5 = ON_ModelGeometryComponent::CreateForExperts
                             (false,(ON_Object *)this_00,true,this_01,
                              (ON_ModelGeometryComponent *)0x0);
          if (pOVar5 == (ON_ModelGeometryComponent *)0x0) {
            (*(this_01->super_ON_Object)._vptr_ON_Object[4])(this_01);
          }
          else {
            ONX_Model::AddManagedModelComponent
                      ((ONX_Model *)local_bd8,(ON_ModelComponent *)(local_bc8 + 0x10),
                       SUB81(pOVar5,0));
            ON_ModelComponentReference::~ON_ModelComponentReference
                      ((ON_ModelComponentReference *)local_bd8);
          }
        }
      }
      sVar11 = sVar11 + 1;
    } while (object_list_count != sVar11);
    uVar3 = version * -0x33333333 + 0x19999998;
    if (((0x19999998 < (uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f)) ||
        (iVar2 = ON_BinaryArchive::CurrentArchiveVersion(), version < iVar2 + -10)) ||
       (iVar2 = ON_BinaryArchive::CurrentArchiveVersion(), iVar2 < version)) {
      version = ON_BinaryArchive::CurrentArchiveVersion();
    }
    ON_String::operator=
              (&local_bb8.m_sStartSectionComments,"Archive created by ON_WriteMultipleObjectArchive"
              );
    bVar1 = ONX_Model::Write((ONX_Model *)(local_bc8 + 0x10),archive,version,(ON_TextLog *)0x0);
    ONX_Model::~ONX_Model((ONX_Model *)(local_bc8 + 0x10));
  }
  return bVar1;
}

Assistant:

bool ON_WriteMultipleObjectArchive( 
          ON_BinaryArchive& archive,
          int version,
					size_t object_list_count,
          const ON_Object* const* object_list
          )
{
  if (object_list_count <= 0 || nullptr == object_list)
    return false;

  ONX_Model model;

  const bool bResolveIdAndNameConflicts = true;

  model.m_properties.m_RevisionHistory.NewRevision();
  
  // 1 Feb 2012 Dale Lear 
  //   http://dev.mcneel.com/bugtrack/?q=98543
  //   These simple object archives have no unit system so they
  //   can be read into a file with no scaling.  Prior to
  //   today the unit system was always millimeters.
  model.m_settings.m_ModelUnitsAndTolerances.m_unit_system.SetUnitSystem( ON::LengthUnitSystem::None );

  ON_Layer* layer = new ON_Layer(ON_Layer::Default);
  layer->SetId();
  layer->SetIndex(0);
  model.AddManagedModelComponent(layer, bResolveIdAndNameConflicts);

  for (size_t object_index = 0; object_index < object_list_count; object_index++)
  {
		const ON_Geometry* geometry = ON_Geometry::Cast(object_list[object_index]);
		if ( ON_BrepEdge::Cast(geometry) )
		{
			// write parent brep
			geometry = static_cast<const ON_BrepEdge*>(geometry)->Brep();
		}
		else if ( ON_BrepTrim::Cast(geometry) )
		{
			geometry = nullptr;
		}
		else if ( ON_BrepLoop::Cast(geometry) )
		{
			geometry = static_cast<const ON_BrepLoop*>(geometry)->Brep();
		}
		else if ( ON_BrepFace::Cast(geometry) )
		{
			// write parent brep
			geometry = static_cast<const ON_BrepFace*>(geometry)->Brep();
		}
		else if ( ON_CurveProxy::Cast(geometry) )
		{
			// write actual curve
			geometry = static_cast<const ON_CurveProxy*>(geometry)->ProxyCurve();
		}
		else if ( ON_SurfaceProxy::Cast(geometry) )
		{
			// write actual surface
			geometry = static_cast<const ON_SurfaceProxy*>(geometry)->ProxySurface();
		}

    if (nullptr == geometry)
      continue;

    // bManageGeometry = false means ~ON_ModelGeometryComponent will not delete geometry
    const bool bManageGeometry = false;
    const bool bManageAttributes = true;
    ON_3dmObjectAttributes* attributes = new ON_3dmObjectAttributes();
    attributes->m_layer_index = layer->Index();
    attributes->m_uuid = ON_CreateId();
    ON_ModelGeometryComponent* mg = ON_ModelGeometryComponent::CreateForExperts(
      bManageGeometry,
      const_cast<ON_Geometry*>(geometry), // safe - see bManageGeometry = false comment above.
      bManageAttributes,
      attributes,
      nullptr
    );

    if (nullptr == mg)
    {
      delete attributes;
      continue;
    }

    model.AddManagedModelComponent( mg, bResolveIdAndNameConflicts );
  }

  if ( (0 != version % 10)
    || version < ON_BinaryArchive::CurrentArchiveVersion() - 10
    || version > ON_BinaryArchive::CurrentArchiveVersion()
    )
  {
    version = ON_BinaryArchive::CurrentArchiveVersion();
  }
  model.m_sStartSectionComments = "Archive created by ON_WriteMultipleObjectArchive";
  bool rc = model.Write(archive, version );

  return rc;
}